

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

void slang::SourceManager::computeLineOffsets
               (SmallVector<char,_40UL> *buffer,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets)

{
  const_pointer pcVar1;
  size_type sVar2;
  value_type_conflict3 *in_RSI;
  SmallVectorBase<char> *in_RDI;
  char *end;
  char *ptr;
  value_type_conflict3 *in_stack_ffffffffffffffb8;
  value_type_conflict3 *__x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             SmallVectorBase<char>::data(in_RDI);
  pcVar1 = SmallVectorBase<char>::data(in_RDI);
  sVar2 = SmallVectorBase<char>::size(in_RDI);
  while (local_20 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pcVar1 + sVar2)) {
    if ((*(char *)&(local_20->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start == '\n') ||
       (*(char *)&(local_20->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start == '\r')) {
      if (((*(char *)((long)&(local_20->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start + 1) == '\n') ||
          (*(char *)((long)&(local_20->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1) == '\r')) &&
         (*(char *)&(local_20->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start !=
          *(char *)((long)&(local_20->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1))) {
        local_20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(local_20->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1);
      }
      local_20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(local_20->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
      __x = in_RSI;
      this = local_20;
      SmallVectorBase<char>::data(in_RDI);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this,__x);
    }
    else {
      local_20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(local_20->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
  }
  return;
}

Assistant:

void SourceManager::computeLineOffsets(const SmallVector<char>& buffer,
                                       std::vector<size_t>& offsets) noexcept {
    // first line always starts at offset 0
    offsets.push_back(0);

    const char* ptr = buffer.data();
    const char* end = buffer.data() + buffer.size();
    while (ptr != end) {
        if (ptr[0] == '\n' || ptr[0] == '\r') {
            // if we see \r\n or \n\r skip both chars
            if ((ptr[1] == '\n' || ptr[1] == '\r') && ptr[0] != ptr[1])
                ptr++;
            ptr++;
            offsets.push_back((size_t)(ptr - buffer.data()));
        }
        else {
            ptr++;
        }
    }
}